

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

uint32_t roaring_bitmap_maximum(roaring_bitmap_t *bm)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  int *piVar4;
  uint8_t uVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  
  iVar3 = (bm->high_low_container).size;
  if (iVar3 < 1) {
    return 0;
  }
  uVar2 = iVar3 - 1;
  piVar4 = (int *)(bm->high_low_container).containers[uVar2];
  uVar5 = (bm->high_low_container).typecodes[uVar2];
  if (uVar5 == '\x04') {
    uVar5 = (uint8_t)piVar4[2];
    piVar4 = *(int **)piVar4;
  }
  if (uVar5 == '\x03') {
    lVar6 = (long)*piVar4;
    if (lVar6 != 0) {
      uVar7 = (uint)(ushort)(*(short *)(*(long *)(piVar4 + 2) + -2 + lVar6 * 4) +
                            *(short *)(*(long *)(piVar4 + 2) + -4 + lVar6 * 4));
      goto LAB_0011b388;
    }
  }
  else if (uVar5 == '\x02') {
    if ((long)*piVar4 != 0) {
      uVar7 = (uint)*(ushort *)(*(long *)(piVar4 + 2) + -2 + (long)*piVar4 * 2);
      goto LAB_0011b388;
    }
  }
  else {
    iVar3 = 0xffff;
    uVar8 = 0x400;
    do {
      uVar7 = (int)uVar8 - 1;
      uVar8 = (ulong)uVar7;
      uVar1 = *(ulong *)(*(long *)(piVar4 + 2) + uVar8 * 8);
      if (uVar1 != 0) {
        lVar6 = 0x3f;
        if (uVar1 != 0) {
          for (; uVar1 >> lVar6 == 0; lVar6 = lVar6 + -1) {
          }
        }
        uVar7 = iVar3 - ((uint)lVar6 ^ 0x3f);
        goto LAB_0011b388;
      }
      iVar3 = iVar3 + -0x40;
    } while (1 < uVar7);
  }
  uVar7 = 0;
LAB_0011b388:
  return (uint)(bm->high_low_container).keys[uVar2] << 0x10 | uVar7 & 0xffff;
}

Assistant:

uint32_t roaring_bitmap_maximum(const roaring_bitmap_t *bm) {
    if (bm->high_low_container.size > 0) {
        container_t *container =
            bm->high_low_container.containers[bm->high_low_container.size - 1];
        uint8_t typecode =
            bm->high_low_container.typecodes[bm->high_low_container.size - 1];
        uint32_t key =
            bm->high_low_container.keys[bm->high_low_container.size - 1];
        uint32_t lowvalue = container_maximum(container, typecode);
        return lowvalue | (key << 16);
    }
    return 0;
}